

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O1

uint32_t __thiscall
wirehair::Codec::Encode(Codec *this,uint32_t block_id,void *block_out,uint32_t out_buffer_bytes)

{
  ushort uVar1;
  ushort uVar2;
  uint8_t *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint16_t peel_x;
  uint uVar8;
  short sVar9;
  Codec *pCVar10;
  short sVar11;
  uint i;
  long lVar12;
  uint uVar13;
  uint uVar14;
  RowMixIterator mix;
  PeelRowParameters params;
  ushort local_5e [3];
  ulong local_58;
  int local_4c;
  uint8_t *local_48;
  PeelRowParameters local_3a;
  
  uVar6 = 0;
  if (block_out != (void *)0x0) {
    uVar1 = this->_block_count;
    pCVar10 = (Codec *)&this->_input_final_bytes;
    if ((block_id & 0xffff) != uVar1 - 1) {
      pCVar10 = this;
    }
    uVar4 = pCVar10->_block_bytes;
    local_58 = (ulong)uVar4;
    if (uVar4 <= out_buffer_bytes) {
      if ((block_id < uVar1) && (this->_original_out_of_order == false)) {
        memcpy(block_out,this->_input_blocks + block_id * this->_block_bytes,local_58);
        uVar6 = uVar4;
      }
      else {
        PeelRowParameters::Initialize(&local_3a,block_id,this->_p_seed,uVar1,this->_mix_count);
        uVar4 = (uint)this->_block_count;
        uVar5 = (uint)this->_block_next_prime;
        uVar7 = (uint)local_3a.PeelFirst;
        uVar13 = (uint)local_3a.PeelAdd;
        uVar1 = this->_mix_count;
        uVar2 = this->_mix_next_prime;
        uVar6 = (uint)local_3a.MixFirst;
        local_5e[0] = local_3a.MixFirst;
        lVar12 = 1;
        do {
          uVar6 = ((uVar6 & 0xffff) + (uint)local_3a.MixAdd) % (uint)uVar2;
          if (uVar1 <= uVar6) {
            uVar6 = uVar2 - uVar6;
            uVar14 = uVar6 & 0xffff;
            if (local_3a.MixAdd < (ushort)uVar6) {
              uVar6 = ((uint)local_3a.MixAdd * 0x10000 - uVar14) % (uint)local_3a.MixAdd;
            }
            else {
              uVar6 = local_3a.MixAdd - uVar14;
            }
          }
          local_5e[lVar12] = (ushort)uVar6;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        puVar3 = this->_recovery_blocks;
        uVar14 = this->_block_bytes;
        uVar8 = uVar14 * uVar7;
        sVar11 = local_3a.PeelCount - 1;
        sVar9 = sVar11;
        if (sVar11 != 0) {
          sVar9 = local_3a.PeelCount - 2;
          uVar7 = (uVar7 + local_3a.PeelAdd) % uVar5;
          if (uVar4 <= uVar7) {
            uVar6 = uVar5 - uVar7 & 0xffff;
            if (local_3a.PeelAdd < (ushort)(uVar5 - uVar7)) {
              uVar7 = (uVar13 * 0x10000 - uVar6) % uVar13;
            }
            else {
              uVar7 = local_3a.PeelAdd - uVar6;
            }
          }
        }
        uVar6 = (uint)local_58;
        if (sVar11 == 0) {
          gf256_addset_mem(block_out,puVar3 + uVar8,puVar3 + (local_3a.MixFirst + uVar4) * uVar14,
                           uVar6);
        }
        else {
          local_48 = puVar3 + (local_3a.MixFirst + uVar4) * uVar14;
          gf256_addset_mem(block_out,puVar3 + uVar8,puVar3 + uVar14 * (uVar7 & 0xffff),uVar6);
          local_4c = uVar13 << 0x10;
          while( true ) {
            sVar11 = sVar9;
            if (sVar9 != 0) {
              sVar11 = sVar9 + -1;
              uVar7 = ((uVar7 & 0xffff) + uVar13) % uVar5;
              if (uVar4 <= uVar7) {
                uVar6 = uVar5 - uVar7 & 0xffff;
                if (local_3a.PeelAdd < (ushort)(uVar5 - uVar7)) {
                  uVar7 = (local_4c - uVar6) % uVar13;
                }
                else {
                  uVar7 = uVar13 - uVar6;
                }
              }
            }
            uVar6 = (uint)local_58;
            if (sVar9 == 0) break;
            gf256_add_mem(block_out,this->_recovery_blocks + (uVar7 & 0xffff) * this->_block_bytes,
                          uVar6);
            sVar9 = sVar11;
          }
          gf256_add_mem(block_out,local_48,uVar6);
        }
        gf256_add2_mem(block_out,
                       this->_recovery_blocks +
                       ((uint)local_5e[1] + (uint)this->_block_count) * this->_block_bytes,
                       this->_recovery_blocks +
                       ((uint)local_5e[2] + (uint)this->_block_count) * this->_block_bytes,uVar6);
      }
    }
  }
  return uVar6;
}

Assistant:

uint32_t Codec::Encode(
    const uint32_t block_id, ///< Block id to generate
    void * GF256_RESTRICT block_out, ///< Block data output
    uint32_t out_buffer_bytes ///< Bytes in block
)
{
    if (!block_out) {
        return 0;
    }

    unsigned copyBytes;

    // If this is the last block:
    if ((uint16_t)block_id == _block_count - 1) {
        copyBytes = _input_final_bytes;
    }
    else {
        copyBytes = _block_bytes;
    }

    // If not enough space in output buffer:
    if (out_buffer_bytes < copyBytes) {
        return 0;
    }

    uint8_t * GF256_RESTRICT data_out = reinterpret_cast<uint8_t *>( block_out );

#if defined(CAT_COPY_FIRST_N)
    // Note that if the encoder was a decoder the original message blocks may
    // not be available, so we regenerate them each time using the recovery set.
    // This means that wirehair_encode() after conversion will be slow for the
    // set of original blocks.  I noted this in the API comments to help devs.

    // For the original message blocks (id < N):
    if (block_id < _block_count &&
        !_original_out_of_order)
    {
        const uint8_t * GF256_RESTRICT src = _input_blocks + _block_bytes * block_id;

        // Copy from the original file data
        memcpy(data_out, src, copyBytes);
        return copyBytes;
    }
#endif // CAT_COPY_FIRST_N

    CAT_IF_DUMP(cout << "Encode: Generating row " << block_id << ":";)

    PeelRowParameters params;
    params.Initialize(block_id, _p_seed, _block_count, _mix_count);

    PeelRowIterator iter(params, _block_count, _block_next_prime);
    const RowMixIterator mix(params, _mix_count, _mix_next_prime);

    const uint16_t peel_0 = iter.GetColumn();

    // Remember first column (there is always at least one)
    CAT_DEBUG_ASSERT(peel_0 < _recovery_rows);
    const uint8_t * GF256_RESTRICT first = _recovery_blocks + _block_bytes * peel_0;

    CAT_IF_DUMP(cout << " " << peel_0;)

    CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[0]) < _recovery_rows);
    const uint8_t * GF256_RESTRICT mix0_src = _recovery_blocks + _block_bytes * (_block_count + mix.Columns[0]);

    // If peeler has multiple columns:
    if (iter.Iterate())
    {
        const uint16_t peel_1 = iter.GetColumn();

        CAT_IF_DUMP(cout << " " << peel_1;)

        CAT_DEBUG_ASSERT(peel_1 < _recovery_rows);

        // Combine first two columns into output buffer (faster than memcpy + memxor)
        gf256_addset_mem(
            data_out,
            first,
            _recovery_blocks + _block_bytes * peel_1,
            copyBytes);

        // For each remaining peeler column:
        while (iter.Iterate())
        {
            const uint16_t peel_x = iter.GetColumn();

            CAT_IF_DUMP(cout << " " << peel_x;)

            CAT_DEBUG_ASSERT(peel_x < _recovery_rows);

            // Mix in each column
            gf256_add_mem(
                data_out,
                _recovery_blocks + _block_bytes * peel_x,
                copyBytes);
        }

        CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[0]) < _recovery_rows);

        // Mix first mixer block in directly
        gf256_add_mem(data_out, mix0_src, copyBytes);
    }
    else
    {
        CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[0]) < _recovery_rows);

        // Mix first with first mixer block (faster than memcpy + memxor)
        gf256_addset_mem(data_out, first, mix0_src, copyBytes);
    }

    CAT_IF_DUMP(cout << " " << (_block_count + mix.Columns[0]);)

    // Add in remaining 2 mixer columns:

    CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[1]) < _recovery_rows);
    const uint8_t * GF256_RESTRICT mix1_src = _recovery_blocks + _block_bytes * (_block_count + mix.Columns[1]);
    CAT_IF_DUMP(cout << " " << (_block_count + mix.Columns[1]);)

    CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[2]) < _recovery_rows);
    const uint8_t * GF256_RESTRICT mix2_src = _recovery_blocks + _block_bytes * (_block_count + mix.Columns[2]);
    CAT_IF_DUMP(cout << " " << (_block_count + mix.Columns[2]);)

    gf256_add2_mem(data_out, mix1_src, mix2_src, copyBytes);

    CAT_IF_DUMP(cout << endl;)

    return copyBytes;
}